

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_UINT32 final)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  OPJ_UINT32 OVar8;
  int iVar9;
  opj_cp_t *poVar10;
  opj_tcd_tile_t *poVar11;
  opj_tcp_t *poVar12;
  opj_tcd_tilecomp_t *poVar13;
  OPJ_INT32 *pOVar14;
  opj_tcd_resolution_t *poVar15;
  opj_tcd_precinct_t *poVar16;
  opj_tcd_cblk_enc_t *poVar17;
  OPJ_BOOL OVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  int *piVar24;
  ulong uVar25;
  int iVar26;
  int *piVar27;
  long lVar28;
  ulong uVar29;
  OPJ_INT32 matrice [10] [10] [3];
  int local_4e8 [302];
  
  poVar10 = tcd->cp;
  poVar11 = tcd->tcd_image->tiles;
  poVar12 = tcd->tcp;
  uVar1 = poVar11->numcomps;
  uVar29 = 0;
  do {
    if (uVar29 == uVar1) {
      return;
    }
    poVar13 = poVar11->comps;
    uVar2 = poVar12->numlayers;
    uVar3 = poVar13[uVar29].numresolutions;
    piVar27 = local_4e8;
    iVar21 = 0;
    for (uVar23 = 0; uVar23 != uVar2; uVar23 = uVar23 + 1) {
      piVar24 = piVar27;
      iVar26 = iVar21;
      for (uVar25 = 0; uVar25 != uVar3; uVar25 = uVar25 + 1) {
        pOVar14 = (poVar10->m_specific_param).m_enc.m_matrice;
        uVar4 = tcd->image->comps[uVar29].prec;
        for (lVar28 = 0; lVar28 != 3; lVar28 = lVar28 + 1) {
          piVar24[lVar28] =
               (int)((float)pOVar14[(uint)(iVar26 + (int)lVar28)] * (float)((double)uVar4 * 0.0625))
          ;
        }
        iVar26 = iVar26 + 3;
        piVar24 = piVar24 + 3;
      }
      iVar21 = iVar21 + uVar3 * 3;
      piVar27 = piVar27 + 0x1e;
    }
    for (uVar23 = 0; uVar23 != uVar3; uVar23 = uVar23 + 1) {
      poVar15 = poVar13[uVar29].resolutions;
      uVar2 = poVar15[uVar23].numbands;
      for (uVar25 = 0; uVar25 != uVar2; uVar25 = uVar25 + 1) {
        OVar18 = opj_tcd_is_band_empty(poVar15[uVar23].bands + uVar25);
        if (OVar18 == 0) {
          OVar5 = poVar15[uVar23].ph;
          OVar6 = poVar15[uVar23].pw;
          for (uVar22 = 0; uVar22 != OVar5 * OVar6; uVar22 = uVar22 + 1) {
            poVar16 = poVar15[uVar23].bands[uVar25].precincts;
            OVar7 = poVar16[uVar22].ch;
            OVar8 = poVar16[uVar22].cw;
            for (lVar28 = 0; (ulong)(OVar7 * OVar8) << 6 != lVar28; lVar28 = lVar28 + 0x40) {
              poVar17 = poVar16[uVar22].cblks.enc;
              iVar26 = tcd->image->comps[uVar29].prec - *(int *)((long)&poVar17->numbps + lVar28);
              iVar21 = local_4e8[(ulong)layno * 0x1e + uVar23 * 3 + uVar25];
              if (layno == 0) {
                iVar19 = iVar21 - iVar26;
                if (iVar19 == 0 || iVar21 < iVar26) {
                  iVar19 = 0;
                }
                *(undefined4 *)((long)&poVar17->numpassesinlayers + lVar28) = 0;
              }
              else {
                iVar9 = local_4e8[(ulong)(layno - 1) * 0x1e + uVar23 * 3 + uVar25];
                iVar19 = iVar21 - iVar9;
                if ((iVar9 - iVar26 == 0 || iVar9 < iVar26) &&
                   (iVar19 = (iVar9 - iVar26) + iVar19, iVar19 < 1)) {
                  iVar19 = 0;
                }
              }
              piVar27 = (int *)((ulong)layno * 0x18 + *(long *)((long)&poVar17->layers + lVar28));
              iVar21 = *(int *)((long)&poVar17->numpassesinlayers + lVar28);
              if (iVar21 == 0) {
                iVar26 = iVar19 * 3 + -2;
                if (iVar19 != 0) {
                  iVar19 = iVar26;
                }
                *piVar27 = iVar19;
                if (iVar19 != 0) {
                  piVar27[1] = *(int *)(*(long *)((long)&poVar17->passes + lVar28) +
                                       (ulong)(iVar19 - 1) * 0x18);
                  lVar20 = *(long *)((long)&poVar17->data + lVar28);
                  goto LAB_00132efe;
                }
              }
              else {
                iVar9 = iVar19 * 3;
                *piVar27 = iVar9;
                if (iVar19 != 0) {
                  lVar20 = *(long *)((long)&poVar17->passes + lVar28);
                  iVar26 = iVar9 + iVar21;
                  uVar4 = *(uint *)(lVar20 + (ulong)(iVar21 - 1) * 0x18);
                  piVar27[1] = *(int *)(lVar20 + (ulong)((iVar9 + iVar21) - 1) * 0x18) - uVar4;
                  lVar20 = (ulong)uVar4 + *(long *)((long)&poVar17->data + lVar28);
LAB_00132efe:
                  *(long *)(piVar27 + 4) = lVar20;
                  if (final != 0) {
                    *(int *)((long)&poVar17->numpassesinlayers + lVar28) = iVar26;
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar29 = uVar29 + 1;
  } while( true );
}

Assistant:

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd, OPJ_UINT32 layno,
                             OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_INT32 value;                        /*, matrice[tcd_tcp->numlayers][tcd_tile->comps[0].numresolutions][3]; */
    OPJ_INT32 matrice[10][10][3];
    OPJ_UINT32 i, j, k;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (i = 0; i < tcd_tcp->numlayers; i++) {
            for (j = 0; j < tilec->numresolutions; j++) {
                for (k = 0; k < 3; k++) {
                    matrice[i][j][k] =
                        (OPJ_INT32)((OPJ_FLOAT32)cp->m_specific_param.m_enc.m_matrice[i *
                                      tilec->numresolutions * 3 + j * 3 + k]
                                    * (OPJ_FLOAT32)(tcd->image->comps[compno].prec / 16.0));
                }
            }
        }

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;
                        OPJ_INT32 imsb = (OPJ_INT32)(tcd->image->comps[compno].prec -
                                                     cblk->numbps); /* number of bit-plan equal to zero */

                        /* Correction of the matrix of coefficient to include the IMSB information */
                        if (layno == 0) {
                            value = matrice[layno][resno][bandno];
                            if (imsb >= value) {
                                value = 0;
                            } else {
                                value -= imsb;
                            }
                        } else {
                            value = matrice[layno][resno][bandno] - matrice[layno - 1][resno][bandno];
                            if (imsb >= matrice[layno - 1][resno][bandno]) {
                                value -= (imsb - matrice[layno - 1][resno][bandno]);
                                if (value < 0) {
                                    value = 0;
                                }
                            }
                        }

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;
                        if (cblk->numpassesinlayers == 0) {
                            if (value != 0) {
                                n = 3 * (OPJ_UINT32)value - 2 + cblk->numpassesinlayers;
                            } else {
                                n = cblk->numpassesinlayers;
                            }
                        } else {
                            n = 3 * (OPJ_UINT32)value + cblk->numpassesinlayers;
                        }

                        layer->numpasses = n - cblk->numpassesinlayers;

                        if (!layer->numpasses) {
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                        }

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
}